

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O2

void fy_emit_mapping_key_prolog
               (fy_emitter *emit,fy_emit_save_ctx *sc,fy_token *fyt_key,_Bool simple_key)

{
  fy_emitter_cfg_flags fVar1;
  undefined7 in_register_00000009;
  uint flags;
  uint uVar2;
  
  uVar2 = sc->flags & 0x10;
  flags = uVar2 + 4;
  sc->flags = flags;
  if ((int)CONCAT71(in_register_00000009,simple_key) != 0) {
    flags = uVar2 | 0xc;
    sc->flags = flags;
    if ((fyt_key != (fy_token *)0x0) && (fyt_key->type == FYTT_SCALAR)) {
      flags = uVar2 | 0x4c;
      sc->flags = flags;
    }
  }
  fVar1 = emit->cfg->flags & 0xf00000;
  if ((fVar1 != FYECF_MODE_FLOW_ONELINE) && (fVar1 != FYECF_MODE_JSON_ONELINE)) {
    fy_emit_write_indent(emit,sc->indent);
    flags = sc->flags;
  }
  if ((flags & 8) == 0) {
    fy_emit_write_indicator(emit,di_question_mark,flags,sc->indent,fyewt_indicator);
    return;
  }
  return;
}

Assistant:

static void fy_emit_mapping_key_prolog(struct fy_emitter *emit, struct fy_emit_save_ctx *sc,
                                       struct fy_token *fyt_key, bool simple_key) {
    sc->flags = DDNF_MAP | (sc->flags & DDNF_FLOW);

    if (simple_key) {
        sc->flags |= DDNF_SIMPLE;
        if (fyt_key && fyt_key->type == FYTT_SCALAR)
            sc->flags |= DDNF_SIMPLE_SCALAR_KEY;
    }

    if (!fy_emit_is_oneline(emit))
        fy_emit_write_indent(emit, sc->indent);

    /* complex? */
    if (!(sc->flags & DDNF_SIMPLE))
        fy_emit_write_indicator(emit, di_question_mark, sc->flags, sc->indent, fyewt_indicator);
}